

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S2_easy.cpp
# Opt level: O2

int256_t * __thiscall
primesum::S2_easy(int256_t *__return_storage_ptr__,primesum *this,int128_t x,int64_t y,int64_t z,
                 int64_t c,int threads)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 x_03 [16];
  undefined1 x_04 [16];
  undefined1 x_05 [16];
  undefined1 x_06 [16];
  undefined1 x_07 [16];
  undefined1 n [16];
  undefined1 x_08 [16];
  undefined1 x_09 [16];
  undefined1 x_10 [16];
  undefined1 x_11 [16];
  undefined1 x_12 [16];
  undefined1 x_13 [16];
  undefined1 n_00 [16];
  undefined1 x_14 [16];
  undefined1 x_15 [16];
  undefined1 x_16 [16];
  undefined1 x_17 [16];
  undefined1 x_18 [16];
  undefined1 x_19 [16];
  undefined1 n_01 [16];
  undefined1 limit [16];
  undefined1 limit_00 [16];
  undefined1 limit_01 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  unsigned___int128 *puVar11;
  uint64_t uVar12;
  unsigned___int128 *puVar13;
  int64_t iVar14;
  unsigned___int128 *puVar15;
  unsigned___int128 *puVar16;
  unsigned___int128 *puVar17;
  int64_t iVar18;
  int64_t iVar19;
  int64_t iVar20;
  type_conflict3 *ptVar21;
  int64_t iVar22;
  unsigned___int128 *puVar23;
  unsigned___int128 *puVar24;
  int64_t iVar25;
  ulong uVar26;
  primesum *ppVar27;
  unsigned___int128 *puVar28;
  int256_t *piVar29;
  undefined4 in_register_0000008c;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  unsigned___int128 *puVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  vector<long,_std::allocator<long>_> primes;
  PiTable pi;
  vector<__int128,_std::allocator<__int128>_> prime_sums;
  S2Status status;
  int256_t phi_xn_sum;
  undefined8 in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  long local_1a0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_160;
  PiTable local_148;
  unsigned___int128 *local_128;
  unsigned___int128 *local_120;
  int256_t local_118;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  S2Status local_e0;
  int256_t local_b8;
  long local_98;
  int64_t local_90;
  int64_t local_88;
  unsigned___int128 *local_80;
  int256_t *local_78;
  double local_70;
  long local_68;
  ulong local_60;
  int256_t local_58;
  
  puVar33 = (unsigned___int128 *)CONCAT44(in_register_0000008c,threads);
  local_90 = c;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"",(allocator<char> *)&local_148);
  print((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"=== S2_easy(x, y) ===",(allocator<char> *)&local_148);
  print((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"Computation of the easy special leaves",
             (allocator<char> *)&local_148);
  print((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  auVar37._8_8_ = in_stack_fffffffffffffe30;
  auVar37._0_8_ = in_stack_fffffffffffffe28;
  print(this,(int128_t)auVar37,y,z,threads);
  local_70 = get_time();
  *(undefined8 *)&__return_storage_ptr__->low = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->low + 8) = 0;
  *(undefined8 *)&__return_storage_ptr__->high = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->high + 8) = 0;
  local_88 = y;
  local_80 = (unsigned___int128 *)z;
  local_78 = __return_storage_ptr__;
  if (z < 0x100000000) {
    generate_primes<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_160,z);
    generate_prime_sums<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f8,z);
    uVar31 = z >> 0x3f;
    if (y < 1) {
      x_14._8_8_ = in_stack_fffffffffffffe30;
      x_14._0_8_ = in_stack_fffffffffffffe28;
      puVar11 = iroot<3,unsigned__int128>
                          ((unsigned___int128 *)this,(primesum *)y,(unsigned___int128)x_14);
      ideal_num_threads((int)x,(int64_t)puVar11,1000);
      PiTable::PiTable(&local_148,z);
      uVar12 = isqrt<long>(z);
      puVar13 = (unsigned___int128 *)PiTable::operator[](&local_148,uVar12);
      iVar14 = PiTable::operator[](&local_148,(uint64_t)puVar11);
      x_15._8_8_ = in_stack_fffffffffffffe30;
      x_15._0_8_ = in_stack_fffffffffffffe28;
      S2Status::S2Status(&local_e0,(int128_t)x_15);
      if ((long)puVar33 < (long)puVar13) {
        puVar33 = puVar13;
      }
      local_128 = (unsigned___int128 *)(iVar14 >> 0x3f);
      auVar9 = ZEXT816(0);
      while ((long)puVar33 < iVar14) {
        puVar15 = (unsigned___int128 *)
                  CONCAT44(0,local_160._M_impl.super__Vector_impl_data._M_start[(long)puVar33 + 1]);
        auVar37 = __udivti3(this,y,puVar15,0);
        ppVar27 = auVar37._8_8_;
        puVar13 = auVar37._0_8_;
        auVar37 = __udivti3(puVar13,ppVar27,puVar15,0);
        puVar11 = auVar37._0_8_;
        if (uVar31 <= auVar37._8_8_ && (ulong)(auVar37._0_8_ < (ulong)z) <= auVar37._8_8_ - uVar31)
        {
          puVar11 = (unsigned___int128 *)z;
        }
        x_16._8_8_ = in_stack_fffffffffffffe30;
        x_16._0_8_ = in_stack_fffffffffffffe28;
        puVar23 = isqrt<unsigned__int128>(puVar13,ppVar27,(unsigned___int128)x_16);
        puVar16 = (unsigned___int128 *)(local_90 / (long)puVar15);
        puVar24 = (unsigned___int128 *)(z / (long)puVar15);
        if (z / (long)puVar15 <= (long)puVar15) {
          puVar24 = puVar15;
        }
        puVar17 = (unsigned___int128 *)z;
        if ((long)puVar23 < z) {
          puVar17 = puVar23;
        }
        if ((long)puVar23 < (long)puVar24) {
          puVar17 = puVar24;
        }
        puVar23 = (unsigned___int128 *)z;
        if ((long)puVar16 < z) {
          puVar23 = puVar16;
        }
        if ((long)puVar16 < (long)puVar24) {
          puVar23 = puVar24;
        }
        iVar18 = PiTable::operator[](&local_148,(uint64_t)puVar11);
        iVar19 = PiTable::operator[](&local_148,(uint64_t)puVar17);
        iVar20 = PiTable::operator[](&local_148,(uint64_t)puVar23);
        local_120 = (unsigned___int128 *)((long)puVar33 + 1);
        while (iVar19 < iVar18) {
          x_17._8_8_ = in_stack_fffffffffffffe30;
          x_17._0_8_ = in_stack_fffffffffffffe28;
          ptVar21 = fast_div<unsigned__int128,unsigned_int>
                              (puVar13,ppVar27,(unsigned___int128)x_17,
                               local_160._M_impl.super__Vector_impl_data._M_start[iVar18]);
          iVar22 = PiTable::operator[](&local_148,(uint64_t)ptVar21);
          iVar25 = PiTable::operator[](&local_148,(uint64_t)ptVar21);
          uVar1 = local_f8._M_impl.super__Vector_impl_data._M_start[iVar25];
          uVar2 = local_f8._M_impl.super__Vector_impl_data._M_start[(long)puVar33];
          x_18._8_8_ = in_stack_fffffffffffffe30;
          x_18._0_8_ = in_stack_fffffffffffffe28;
          ptVar21 = fast_div<unsigned__int128,unsigned_int>
                              (puVar13,ppVar27,(unsigned___int128)x_18,
                               local_160._M_impl.super__Vector_impl_data._M_start[iVar22 + 1]);
          if ((long)ptVar21 <= (long)puVar17) {
            ptVar21 = puVar17;
          }
          iVar22 = PiTable::operator[](&local_148,(uint64_t)ptVar21);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = (uVar1 - uVar2) + 1;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = puVar15;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = SUB168(auVar3 * auVar6,0);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = local_f8._M_impl.super__Vector_impl_data._M_start[iVar18] -
                         local_f8._M_impl.super__Vector_impl_data._M_start[iVar22];
          auVar10._8_8_ =
               SUB168(auVar4 * auVar7,8) +
               SUB168(auVar3 * auVar6,8) *
               (local_f8._M_impl.super__Vector_impl_data._M_start[iVar18] -
               local_f8._M_impl.super__Vector_impl_data._M_start[iVar22]);
          auVar10._0_8_ = SUB168(auVar4 * auVar7,0);
          auVar9 = auVar9 + auVar10;
          iVar18 = iVar22;
          z = (int64_t)local_80;
          y = local_88;
        }
        for (; iVar20 < iVar18; iVar18 = iVar18 + -1) {
          x_19._8_8_ = in_stack_fffffffffffffe30;
          x_19._0_8_ = in_stack_fffffffffffffe28;
          ptVar21 = fast_div<unsigned__int128,unsigned_int>
                              (puVar13,ppVar27,(unsigned___int128)x_19,
                               local_160._M_impl.super__Vector_impl_data._M_start[iVar18]);
          iVar19 = PiTable::operator[](&local_148,(uint64_t)ptVar21);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = (ulong)local_160._M_impl.super__Vector_impl_data._M_start[iVar18] *
                         (long)puVar15;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = (local_f8._M_impl.super__Vector_impl_data._M_start[iVar19] -
                         local_f8._M_impl.super__Vector_impl_data._M_start[(long)puVar33]) + 1;
          auVar9 = auVar5 * auVar8 + auVar9;
        }
        bVar34 = is_print();
        puVar33 = local_120;
        if (bVar34) {
          n_01._8_8_ = in_stack_fffffffffffffe30;
          n_01._0_8_ = in_stack_fffffffffffffe28;
          limit_01._8_8_ = in_stack_fffffffffffffe40;
          limit_01._0_8_ = in_stack_fffffffffffffe38;
          S2Status::print(&local_e0,(int128_t)n_01,(int128_t)limit_01);
        }
      }
      std::_Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>::
      ~_Vector_base((_Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                     *)&local_148);
      local_1b8 = 0;
      local_1a0 = 0;
    }
    else {
      x_08._8_8_ = in_stack_fffffffffffffe30;
      x_08._0_8_ = in_stack_fffffffffffffe28;
      puVar11 = iroot<3,unsigned__int128>
                          ((unsigned___int128 *)this,(primesum *)y,(unsigned___int128)x_08);
      ideal_num_threads((int)x,(int64_t)puVar11,1000);
      PiTable::PiTable(&local_148,z);
      uVar12 = isqrt<long>(z);
      puVar13 = (unsigned___int128 *)PiTable::operator[](&local_148,uVar12);
      local_98 = PiTable::operator[](&local_148,(uint64_t)puVar11);
      x_09._8_8_ = in_stack_fffffffffffffe30;
      x_09._0_8_ = in_stack_fffffffffffffe28;
      S2Status::S2Status(&local_e0,(int128_t)x_09);
      if ((long)puVar33 < (long)puVar13) {
        puVar33 = puVar13;
      }
      local_68 = local_98 >> 0x3f;
      local_1a8 = 0;
      local_1b0 = 0;
      local_1b8 = 0;
      local_1a0 = 0;
      local_60 = uVar31;
      while (auVar9._8_8_ = local_1b0, auVar9._0_8_ = local_1a8, (long)puVar33 < local_98) {
        puVar24 = (unsigned___int128 *)
                  (ulong)local_160._M_impl.super__Vector_impl_data._M_start[(long)puVar33 + 1];
        auVar37 = __udivti3(this,local_88,puVar24,0);
        ppVar27 = auVar37._8_8_;
        puVar15 = auVar37._0_8_;
        auVar37 = __udivti3(puVar15,ppVar27,puVar24,0);
        puVar11 = local_80;
        puVar13 = auVar37._0_8_;
        if (local_60 <= auVar37._8_8_ &&
            (ulong)(auVar37._0_8_ < local_80) <= auVar37._8_8_ - local_60) {
          puVar13 = local_80;
        }
        x_10._8_8_ = in_stack_fffffffffffffe30;
        x_10._0_8_ = in_stack_fffffffffffffe28;
        puVar16 = isqrt<unsigned__int128>(puVar15,ppVar27,(unsigned___int128)x_10);
        puVar17 = (unsigned___int128 *)(local_90 / (long)puVar24);
        puVar23 = (unsigned___int128 *)((long)puVar11 / (long)puVar24);
        if ((long)puVar11 / (long)puVar24 <= (long)puVar24) {
          puVar23 = puVar24;
        }
        puVar28 = puVar11;
        if ((long)puVar16 < (long)puVar11) {
          puVar28 = puVar16;
        }
        if ((long)puVar16 < (long)puVar23) {
          puVar28 = puVar23;
        }
        if ((long)puVar17 < (long)puVar11) {
          puVar11 = puVar17;
        }
        if ((long)puVar17 < (long)puVar23) {
          puVar11 = puVar23;
        }
        iVar14 = PiTable::operator[](&local_148,(uint64_t)puVar13);
        local_120 = (unsigned___int128 *)PiTable::operator[](&local_148,(uint64_t)puVar28);
        iVar18 = PiTable::operator[](&local_148,(uint64_t)puVar11);
        local_128 = (unsigned___int128 *)((long)puVar33 + 1);
        while ((long)local_120 < iVar14) {
          x_11._8_8_ = in_stack_fffffffffffffe30;
          x_11._0_8_ = in_stack_fffffffffffffe28;
          ptVar21 = fast_div<unsigned__int128,unsigned_int>
                              (puVar15,ppVar27,(unsigned___int128)x_11,
                               local_160._M_impl.super__Vector_impl_data._M_start[iVar14]);
          iVar19 = PiTable::operator[](&local_148,(uint64_t)ptVar21);
          iVar20 = PiTable::operator[](&local_148,(uint64_t)ptVar21);
          local_b8.low._0_8_ =
               (local_f8._M_impl.super__Vector_impl_data._M_start[iVar20] -
               local_f8._M_impl.super__Vector_impl_data._M_start[(long)puVar33]) + 1;
          local_b8.low._8_8_ = 0;
          local_b8.high._0_8_ = 0;
          local_b8.high._8_8_ = 0;
          x_12._8_8_ = in_stack_fffffffffffffe30;
          x_12._0_8_ = in_stack_fffffffffffffe28;
          ptVar21 = fast_div<unsigned__int128,unsigned_int>
                              (puVar15,ppVar27,(unsigned___int128)x_12,
                               local_160._M_impl.super__Vector_impl_data._M_start[iVar19 + 1]);
          if ((long)ptVar21 <= (long)puVar28) {
            ptVar21 = puVar28;
          }
          iVar19 = PiTable::operator[](&local_148,(uint64_t)ptVar21);
          int256_t::operator*(&local_58,&local_b8,(long)puVar24);
          int256_t::operator*(&local_118,&local_58,
                              local_f8._M_impl.super__Vector_impl_data._M_start[iVar14] -
                              local_f8._M_impl.super__Vector_impl_data._M_start[iVar19]);
          bVar34 = CARRY8(local_1b8,(ulong)local_118.high);
          uVar26 = local_1b8 + (ulong)local_118.high;
          bVar35 = CARRY8(local_1a8,(ulong)local_118.low);
          local_1a8 = local_1a8 + (ulong)local_118.low;
          bVar36 = CARRY8(local_1b0,local_118.low._8_8_);
          uVar31 = local_1b0 + local_118.low._8_8_;
          local_1b0 = uVar31 + bVar35;
          uVar31 = (ulong)(bVar36 || CARRY8(uVar31,(ulong)bVar35));
          local_1b8 = uVar26 + uVar31;
          local_1a0 = local_1a0 + local_118.high._8_8_ + (ulong)bVar34 +
                      (ulong)CARRY8(uVar26,uVar31);
          iVar14 = iVar19;
        }
        for (; iVar18 < iVar14; iVar14 = iVar14 + -1) {
          x_13._8_8_ = in_stack_fffffffffffffe30;
          x_13._0_8_ = in_stack_fffffffffffffe28;
          ptVar21 = fast_div<unsigned__int128,unsigned_int>
                              (puVar15,ppVar27,(unsigned___int128)x_13,
                               local_160._M_impl.super__Vector_impl_data._M_start[iVar14]);
          iVar19 = PiTable::operator[](&local_148,(uint64_t)ptVar21);
          local_b8.low._0_8_ =
               (local_f8._M_impl.super__Vector_impl_data._M_start[iVar19] -
               local_f8._M_impl.super__Vector_impl_data._M_start[(long)puVar33]) + 1;
          local_b8.low._8_8_ = 0;
          local_b8.high._0_8_ = 0;
          local_b8.high._8_8_ = 0;
          int256_t::operator*(&local_118,&local_b8,
                              (ulong)local_160._M_impl.super__Vector_impl_data._M_start[iVar14] *
                              (long)puVar24);
          bVar34 = CARRY8(local_1b8,(ulong)local_118.high);
          uVar26 = local_1b8 + (ulong)local_118.high;
          bVar35 = CARRY8(local_1a8,(ulong)local_118.low);
          local_1a8 = local_1a8 + (ulong)local_118.low;
          bVar36 = CARRY8(local_1b0,local_118.low._8_8_);
          uVar31 = local_1b0 + local_118.low._8_8_;
          local_1b0 = uVar31 + bVar35;
          uVar31 = (ulong)(bVar36 || CARRY8(uVar31,(ulong)bVar35));
          local_1b8 = uVar26 + uVar31;
          local_1a0 = local_1a0 + local_118.high._8_8_ + (ulong)bVar34 +
                      (ulong)CARRY8(uVar26,uVar31);
        }
        bVar34 = is_print();
        puVar33 = local_128;
        if (bVar34) {
          n_00._8_8_ = in_stack_fffffffffffffe30;
          n_00._0_8_ = in_stack_fffffffffffffe28;
          limit_00._8_8_ = in_stack_fffffffffffffe40;
          limit_00._0_8_ = in_stack_fffffffffffffe38;
          S2Status::print(&local_e0,(int128_t)n_00,(int128_t)limit_00);
        }
      }
      std::_Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>::
      ~_Vector_base((_Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                     *)&local_148);
    }
    piVar29 = local_78;
    local_78->low = (uint128_t)auVar9;
    *(ulong *)&local_78->high = local_1b8;
    *(long *)((long)&local_78->high + 8) = local_1a0;
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_f8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_160);
  }
  else {
    generate_primes<long>((vector<long,_std::allocator<long>_> *)&local_160,z);
    generate_prime_sums<__int128>((vector<__int128,_std::allocator<__int128>_> *)&local_f8,z);
    x_00._8_8_ = in_stack_fffffffffffffe30;
    x_00._0_8_ = in_stack_fffffffffffffe28;
    puVar11 = iroot<3,unsigned__int128>
                        ((unsigned___int128 *)this,(primesum *)y,(unsigned___int128)x_00);
    ideal_num_threads((int)x,(int64_t)puVar11,1000);
    PiTable::PiTable(&local_148,z);
    uVar12 = isqrt<long>(z);
    puVar13 = (unsigned___int128 *)PiTable::operator[](&local_148,uVar12);
    iVar14 = PiTable::operator[](&local_148,(uint64_t)puVar11);
    x_01._8_8_ = in_stack_fffffffffffffe30;
    x_01._0_8_ = in_stack_fffffffffffffe28;
    S2Status::S2Status(&local_e0,(int128_t)x_01);
    if ((long)puVar33 < (long)puVar13) {
      puVar33 = puVar13;
    }
    local_128 = (unsigned___int128 *)(iVar14 >> 0x3f);
    local_1a8 = 0;
    local_1b0 = 0;
    uVar31 = 0;
    lVar32 = 0;
    while ((long)puVar33 < iVar14) {
      puVar11 = *(unsigned___int128 **)
                 (local_160._M_impl.super__Vector_impl_data._M_start + (long)puVar33 * 2 + 2);
      auVar37 = __udivti3(this,local_88,puVar11,(long)puVar11 >> 0x3f);
      ppVar27 = auVar37._8_8_;
      puVar24 = auVar37._0_8_;
      auVar37 = __udivti3(puVar24,ppVar27,puVar11,(long)puVar11 >> 0x3f);
      puVar13 = local_80;
      puVar15 = auVar37._0_8_;
      if ((ulong)(auVar37._0_8_ < local_80) <= auVar37._8_8_) {
        puVar15 = local_80;
      }
      x_02._8_8_ = in_stack_fffffffffffffe30;
      x_02._0_8_ = in_stack_fffffffffffffe28;
      puVar16 = isqrt<unsigned__int128>(puVar24,ppVar27,(unsigned___int128)x_02);
      puVar17 = (unsigned___int128 *)(local_90 / (long)puVar11);
      puVar23 = (unsigned___int128 *)((long)puVar13 / (long)puVar11);
      if ((long)puVar13 / (long)puVar11 <= (long)puVar11) {
        puVar23 = puVar11;
      }
      puVar28 = puVar13;
      if ((long)puVar16 < (long)puVar13) {
        puVar28 = puVar16;
      }
      if ((long)puVar16 < (long)puVar23) {
        puVar28 = puVar23;
      }
      if ((long)puVar17 < (long)puVar13) {
        puVar13 = puVar17;
      }
      if ((long)puVar17 < (long)puVar23) {
        puVar13 = puVar23;
      }
      iVar18 = PiTable::operator[](&local_148,(uint64_t)puVar15);
      local_120 = puVar28;
      iVar19 = PiTable::operator[](&local_148,(uint64_t)puVar28);
      iVar20 = PiTable::operator[](&local_148,(uint64_t)puVar13);
      puVar13 = (unsigned___int128 *)((long)puVar33 + 1);
      while (iVar19 < iVar18) {
        x_03._8_8_ = in_stack_fffffffffffffe30;
        x_03._0_8_ = in_stack_fffffffffffffe28;
        ptVar21 = fast_div<unsigned__int128,long>
                            (puVar24,ppVar27,(unsigned___int128)x_03,
                             *(long *)(local_160._M_impl.super__Vector_impl_data._M_start +
                                      iVar18 * 2));
        iVar18 = PiTable::operator[](&local_148,(uint64_t)ptVar21);
        iVar22 = PiTable::operator[](&local_148,(uint64_t)ptVar21);
        uVar26 = local_f8._M_impl.super__Vector_impl_data._M_start[iVar22 * 2] -
                 local_f8._M_impl.super__Vector_impl_data._M_start[(long)puVar33 * 2];
        local_b8.low._0_8_ = uVar26 + 1;
        local_b8.low._8_8_ =
             ((local_f8._M_impl.super__Vector_impl_data._M_start[iVar22 * 2 + 1] -
              local_f8._M_impl.super__Vector_impl_data._M_start[(long)puVar33 * 2 + 1]) -
             (ulong)(local_f8._M_impl.super__Vector_impl_data._M_start[iVar22 * 2] <
                    local_f8._M_impl.super__Vector_impl_data._M_start[(long)puVar33 * 2])) +
             (ulong)(0xfffffffffffffffe < uVar26);
        local_b8.high._0_8_ = local_b8.low._8_8_ >> 0x3f;
        x_04._8_8_ = in_stack_fffffffffffffe30;
        x_04._0_8_ = in_stack_fffffffffffffe28;
        local_b8.high._8_8_ = (long)local_b8.high;
        ptVar21 = fast_div<unsigned__int128,long>
                            (puVar24,ppVar27,(unsigned___int128)x_04,
                             *(long *)(local_160._M_impl.super__Vector_impl_data._M_start +
                                      iVar18 * 2 + 2));
        if ((long)ptVar21 <= (long)local_120) {
          ptVar21 = local_120;
        }
        iVar18 = PiTable::operator[](&local_148,(uint64_t)ptVar21);
        int256_t::operator*(&local_58,&local_b8,(long)puVar11);
        x_05._8_8_ = in_stack_fffffffffffffe30;
        x_05._0_8_ = in_stack_fffffffffffffe28;
        int256_t::operator*(&local_118,&local_58,(__int128)x_05);
        bVar34 = CARRY8(uVar31,(ulong)local_118.high);
        uVar30 = uVar31 + (ulong)local_118.high;
        bVar35 = CARRY8(local_1a8,(ulong)local_118.low);
        local_1a8 = local_1a8 + (ulong)local_118.low;
        bVar36 = CARRY8(local_1b0,local_118.low._8_8_);
        uVar31 = local_1b0 + local_118.low._8_8_;
        local_1b0 = uVar31 + bVar35;
        uVar26 = (ulong)(bVar36 || CARRY8(uVar31,(ulong)bVar35));
        uVar31 = uVar30 + uVar26;
        lVar32 = lVar32 + local_118.high._8_8_ + (ulong)bVar34 + (ulong)CARRY8(uVar30,uVar26);
      }
      for (; iVar20 < iVar18; iVar18 = iVar18 + -1) {
        x_06._8_8_ = in_stack_fffffffffffffe30;
        x_06._0_8_ = in_stack_fffffffffffffe28;
        ptVar21 = fast_div<unsigned__int128,long>
                            (puVar24,ppVar27,(unsigned___int128)x_06,
                             *(long *)(local_160._M_impl.super__Vector_impl_data._M_start +
                                      iVar18 * 2));
        iVar19 = PiTable::operator[](&local_148,(uint64_t)ptVar21);
        uVar26 = local_f8._M_impl.super__Vector_impl_data._M_start[iVar19 * 2] -
                 local_f8._M_impl.super__Vector_impl_data._M_start[(long)puVar33 * 2];
        local_b8.low._0_8_ = uVar26 + 1;
        local_b8.low._8_8_ =
             ((local_f8._M_impl.super__Vector_impl_data._M_start[iVar19 * 2 + 1] -
              local_f8._M_impl.super__Vector_impl_data._M_start[(long)puVar33 * 2 + 1]) -
             (ulong)(local_f8._M_impl.super__Vector_impl_data._M_start[iVar19 * 2] <
                    local_f8._M_impl.super__Vector_impl_data._M_start[(long)puVar33 * 2])) +
             (ulong)(0xfffffffffffffffe < uVar26);
        local_b8.high._0_8_ = local_b8.low._8_8_ >> 0x3f;
        x_07._8_8_ = in_stack_fffffffffffffe30;
        x_07._0_8_ = in_stack_fffffffffffffe28;
        local_b8.high._8_8_ = (long)local_b8.high;
        int256_t::operator*(&local_118,&local_b8,(__int128)x_07);
        bVar34 = CARRY8(uVar31,(ulong)local_118.high);
        uVar30 = uVar31 + (ulong)local_118.high;
        bVar35 = CARRY8(local_1a8,(ulong)local_118.low);
        local_1a8 = local_1a8 + (ulong)local_118.low;
        bVar36 = CARRY8(local_1b0,local_118.low._8_8_);
        uVar31 = local_1b0 + local_118.low._8_8_;
        local_1b0 = uVar31 + bVar35;
        uVar26 = (ulong)(bVar36 || CARRY8(uVar31,(ulong)bVar35));
        uVar31 = uVar30 + uVar26;
        lVar32 = lVar32 + local_118.high._8_8_ + (ulong)bVar34 + (ulong)CARRY8(uVar30,uVar26);
      }
      bVar34 = is_print();
      puVar33 = puVar13;
      if (bVar34) {
        n._8_8_ = in_stack_fffffffffffffe30;
        n._0_8_ = in_stack_fffffffffffffe28;
        limit._8_8_ = in_stack_fffffffffffffe40;
        limit._0_8_ = in_stack_fffffffffffffe38;
        S2Status::print(&local_e0,(int128_t)n,(int128_t)limit);
      }
    }
    std::_Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>::
    ~_Vector_base((_Vector_base<primesum::PiTable::PiData,_std::allocator<primesum::PiTable::PiData>_>
                   *)&local_148);
    piVar29 = local_78;
    *(ulong *)((long)&local_78->low + 8) = local_1b0;
    *(ulong *)&local_78->low = local_1a8;
    *(long *)((long)&local_78->high + 8) = lVar32;
    *(ulong *)&local_78->high = uVar31;
    std::_Vector_base<__int128,_std::allocator<__int128>_>::~_Vector_base
              ((_Vector_base<__int128,_std::allocator<__int128>_> *)&local_f8);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              ((_Vector_base<long,_std::allocator<long>_> *)&local_160);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"S2_easy",(allocator<char> *)&local_148);
  print((string *)&local_e0,*piVar29,local_70);
  std::__cxx11::string::~string((string *)&local_e0);
  return piVar29;
}

Assistant:

int256_t S2_easy(int128_t x,
                 int64_t y,
                 int64_t z,
                 int64_t c,
                 int threads)
{
  print("");
  print("=== S2_easy(x, y) ===");
  print("Computation of the easy special leaves");
  print(x, y, c, threads);

  double time = get_time();
  int256_t s2_easy;

  // uses less memory
  if (y <= numeric_limits<uint32_t>::max())
  {
    auto primes = generate_primes<uint32_t>(y);
    auto prime_sums = generate_prime_sums<uint64_t>(y);

    if (x <= numeric_limits<uint64_t>::max())
      s2_easy = S2_easy_OpenMP<int128_t>(x, y, z, c, primes, prime_sums, threads);
    else
      s2_easy = S2_easy_OpenMP<int256_t>(x, y, z, c, primes, prime_sums, threads);
  }
  else
  {
    auto primes = generate_primes<int64_t>(y);
    auto prime_sums = generate_prime_sums<int128_t>(y);

    s2_easy = S2_easy_OpenMP<int256_t>(x, y, z, c, primes, prime_sums, threads);
  }

  print("S2_easy", s2_easy, time);
  return s2_easy;
}